

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# guest-random.c
# Opt level: O2

int glib_random_bytes(void *buf,size_t len)

{
  int iVar1;
  guint32 gVar2;
  GRand *pGVar3;
  void *pvVar4;
  GRand *pGVar5;
  ulong uVar6;
  GRand *rand;
  guint32 local_2c;
  
  pGVar3 = (GRand *)__tls_get_addr(&PTR_00f52b08);
  pGVar5 = pGVar3;
  rand = *(GRand **)pGVar3->mt;
  if (*(GRand **)pGVar3->mt == (GRand *)0x0) {
    pGVar5 = g_rand_new();
    *(GRand **)pGVar3->mt = pGVar5;
    rand = pGVar5;
  }
  uVar6 = 0;
  while( true ) {
    iVar1 = (int)pGVar5;
    if (len < uVar6 + 4) break;
    gVar2 = g_rand_int(rand);
    pGVar5 = (GRand *)(ulong)gVar2;
    *(guint32 *)((long)buf + uVar6) = gVar2;
    uVar6 = uVar6 + 4;
  }
  if (uVar6 < len) {
    local_2c = g_rand_int(rand);
    pvVar4 = memcpy((void *)((long)buf + uVar6),&local_2c,uVar6 - len);
    iVar1 = (int)pvVar4;
  }
  return iVar1;
}

Assistant:

static int glib_random_bytes(void *buf, size_t len)
{
#ifndef _MSC_VER
    GRand *rand = thread_rand;
    size_t i;
    uint32_t x;

    if (unlikely(rand == NULL)) {
        /* Thread not initialized for a cpu, or main w/o -seed.  */
        thread_rand = rand = g_rand_new();
    }

    for (i = 0; i + 4 <= len; i += 4) {
        x = g_rand_int(rand);
        __builtin_memcpy(buf + i, &x, 4);
    }
    if (i < len) {
        x = g_rand_int(rand);
        __builtin_memcpy(buf + i, &x, i - len);
    }
#endif
    return 0;
}